

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_proxy(session_impl *this)

{
  pointer psVar1;
  element_type *this_00;
  bool send_local_ep;
  pointer psVar2;
  proxy_settings local_98;
  
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    this_00 = (((psVar2->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->udp_sock).
              super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    proxy_settings::proxy_settings(&local_98,&this->m_settings);
    send_local_ep = session_settings::get_bool(&this->m_settings,0x8053);
    udp_socket::set_proxy_settings
              (&this_00->sock,&local_98,&this->m_alerts,
               &(this->m_host_resolver).super_resolver_interface,send_local_ep);
    proxy_settings::~proxy_settings(&local_98);
  }
  return;
}

Assistant:

void session_impl::update_proxy()
	{
		for (auto& i : m_listen_sockets)
			i->udp_sock->sock.set_proxy_settings(proxy(), m_alerts, get_resolver()
				, settings().get_bool(settings_pack::socks5_udp_send_local_ep));
	}